

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNStat.cpp
# Opt level: O2

void __thiscall NaPNStatistics::action(NaPNStatistics *this)

{
  NaVector *this_00;
  NaVector *this_01;
  NaVector *this_02;
  NaVector *this_03;
  NaVector *this_04;
  double dVar1;
  double dVar2;
  NaReal NVar3;
  double dVar4;
  double dVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  NaVector *pNVar9;
  undefined4 extraout_var;
  NaReal *pNVar10;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  NaPetriNet *pNVar11;
  NaTimer *pNVar12;
  undefined4 extraout_var_06;
  double *pdVar13;
  NaVector *pNVar14;
  undefined4 extraout_var_07;
  NaReal *pNVar15;
  char *pcVar16;
  long lVar17;
  uint uVar18;
  uint uVar19;
  bool bVar20;
  bool bVar21;
  undefined4 extraout_XMM0_Da;
  undefined4 uVar22;
  undefined4 extraout_XMM0_Db;
  undefined4 uVar23;
  double dVar24;
  
  pNVar9 = NaPetriCnInput::data(&this->signal);
  uVar18 = this->nGapAct;
  if (this->nGapWidth - 1 < uVar18) {
    NaVector::init_zero(&this->Mean);
    NaVector::init_zero(&this->RMS);
    NaVector::init_zero(&this->StdDev);
    NaVector::init_zero(&this->Min);
    NaVector::init_zero(&this->Max);
    NaVector::init_zero(&this->Sum);
    NaVector::init_zero(&this->Sum2);
    uVar18 = 0;
  }
  this->nGapAct = uVar18 + 1;
  this_00 = &this->Min;
  this_01 = &this->Max;
  this_02 = &this->Mean;
  this_03 = &this->RMS;
  this_04 = &this->StdDev;
  for (uVar18 = 0; uVar6 = (*pNVar9->_vptr_NaVector[6])(pNVar9), uVar18 < uVar6; uVar18 = uVar18 + 1
      ) {
    iVar7 = (*pNVar9->_vptr_NaVector[8])(pNVar9,(ulong)uVar18);
    dVar1 = *(double *)CONCAT44(extraout_var,iVar7);
    pNVar10 = NaVector::operator[](&this->Sum,uVar18);
    *pNVar10 = dVar1 + *pNVar10;
    iVar7 = (*pNVar9->_vptr_NaVector[8])(pNVar9,(ulong)uVar18);
    dVar1 = *(double *)CONCAT44(extraout_var_00,iVar7);
    iVar7 = (*pNVar9->_vptr_NaVector[8])(pNVar9,(ulong)uVar18);
    dVar2 = *(double *)CONCAT44(extraout_var_01,iVar7);
    pNVar10 = NaVector::operator[](&this->Sum2,uVar18);
    *pNVar10 = dVar1 * dVar2 + *pNVar10;
    uVar6 = this->nGapAct;
    iVar7 = (*pNVar9->_vptr_NaVector[8])(pNVar9,(ulong)uVar18);
    dVar1 = *(double *)CONCAT44(extraout_var_02,iVar7);
    pNVar10 = NaVector::operator[](this_00,uVar18);
    if (uVar6 == 1) {
      *pNVar10 = dVar1;
LAB_00141d1d:
      iVar7 = (*pNVar9->_vptr_NaVector[8])(pNVar9,(ulong)uVar18);
      NVar3 = *(NaReal *)CONCAT44(extraout_var_05,iVar7);
      pNVar10 = NaVector::operator[](this_01,uVar18);
      *pNVar10 = NVar3;
    }
    else {
      if (dVar1 < *pNVar10) {
        iVar7 = (*pNVar9->_vptr_NaVector[8])(pNVar9,(ulong)uVar18);
        NVar3 = *(NaReal *)CONCAT44(extraout_var_03,iVar7);
        pNVar10 = NaVector::operator[](this_00,uVar18);
        *pNVar10 = NVar3;
      }
      iVar7 = (*pNVar9->_vptr_NaVector[8])(pNVar9,(ulong)uVar18);
      dVar1 = *(double *)CONCAT44(extraout_var_04,iVar7);
      pNVar10 = NaVector::operator[](this_01,uVar18);
      if (*pNVar10 <= dVar1 && dVar1 != *pNVar10) goto LAB_00141d1d;
    }
    pNVar10 = NaVector::operator[](&this->Sum,uVar18);
    dVar1 = *pNVar10;
    uVar6 = this->nGapAct;
    pNVar10 = NaVector::operator[](this_02,uVar18);
    *pNVar10 = dVar1 / (double)uVar6;
    pNVar10 = NaVector::operator[](&this->Sum2,uVar18);
    dVar1 = *pNVar10;
    uVar6 = this->nGapAct;
    pNVar10 = NaVector::operator[](this_03,uVar18);
    *pNVar10 = dVar1 / (double)uVar6;
    pNVar10 = NaVector::operator[](this_03,uVar18);
    dVar1 = *pNVar10;
    pNVar10 = NaVector::operator[](this_02,uVar18);
    dVar2 = *pNVar10;
    pNVar10 = NaVector::operator[](this_02,uVar18);
    dVar1 = dVar1 - dVar2 * *pNVar10;
    if (dVar1 < 0.0) {
      dVar1 = sqrt(dVar1);
    }
    else {
      dVar1 = SQRT(dVar1);
    }
    pNVar10 = NaVector::operator[](this_04,uVar18);
    *pNVar10 = dVar1;
  }
  iVar7 = 0;
  pNVar10 = NaVector::operator[](this_00,0);
  dVar1 = *pNVar10;
  pNVar10 = NaVector::operator[](this_01,0);
  pNVar14 = this_01;
  if (ABS(*pNVar10) < ABS(dVar1)) {
    pNVar14 = this_00;
  }
  pNVar10 = NaVector::operator[](pNVar14,0);
  dVar2 = ABS(*pNVar10);
  pNVar11 = NaPetriNode::net(&this->super_NaPetriNode);
  pNVar12 = NaPetriNet::timer(pNVar11);
  (*pNVar12->_vptr_NaTimer[4])(pNVar12);
  dVar1 = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
  pNVar11 = NaPetriNode::net(&this->super_NaPetriNode);
  pNVar12 = NaPetriNet::timer(pNVar11);
  iVar8 = (*pNVar12->_vptr_NaTimer[5])(pNVar12);
  dVar5 = (double)iVar8;
  for (; iVar7 != 10; iVar7 = iVar7 + 1) {
    uVar18 = 1 << ((byte)iVar7 & 0x1f) & (uint)(ushort)this->mOutStat;
    switch(uVar18) {
    case 1:
      pNVar10 = NaVector::operator[](this_02,0);
      dVar4 = ABS(*pNVar10);
      goto LAB_00141fca;
    case 2:
      pNVar14 = this_02;
      break;
    case 3:
    case 5:
    case 6:
    case 7:
      goto switchD_00141f82_caseD_3;
    case 4:
      pNVar14 = this_03;
      break;
    case 8:
      pNVar14 = this_04;
      break;
    default:
      pNVar14 = this_01;
      if ((uVar18 == 0x10) || (pNVar14 = this_00, uVar18 == 0x20)) break;
      dVar4 = dVar2;
      if ((uVar18 == 0x40) || ((dVar4 = dVar1, uVar18 == 0x80 || (dVar4 = dVar5, uVar18 == 0x100))))
      goto LAB_00141fca;
      if (uVar18 != 0x200) goto switchD_00141f82_caseD_3;
      iVar8 = (*pNVar9->_vptr_NaVector[8])(pNVar9,0);
      pdVar13 = (double *)CONCAT44(extraout_var_06,iVar8);
      goto LAB_00141fc6;
    }
    pdVar13 = NaVector::operator[](pNVar14,0);
LAB_00141fc6:
    dVar4 = *pdVar13;
LAB_00141fca:
    pNVar14 = NaPetriCnOutput::data(&this->stat);
    iVar8 = (*pNVar14->_vptr_NaVector[8])(pNVar14);
    *(double *)CONCAT44(extraout_var_07,iVar8) = dVar4;
switchD_00141f82_caseD_3:
  }
  if (this->nGapWidth - 1 < this->nGapAct) {
    pNVar10 = &this->HaltCond[0].value;
    uVar18 = 0;
    for (lVar17 = 0; lVar17 != 10; lVar17 = lVar17 + 1) {
      uVar19 = 1 << ((byte)lVar17 & 0x1f);
      uVar6 = this->mHalt & uVar19 & 0xffff;
      switch(uVar6) {
      case 1:
        pNVar15 = NaVector::operator[](this_02,0);
        uVar22 = SUB84(ABS(*pNVar15),0);
        uVar23 = (undefined4)((ulong)ABS(*pNVar15) >> 0x20);
        goto LAB_0014211d;
      case 2:
        pNVar9 = this_02;
        break;
      case 3:
      case 5:
      case 6:
      case 7:
        goto switchD_001420a1_caseD_3;
      case 4:
        pNVar9 = this_03;
        break;
      case 8:
        pNVar9 = this_04;
        break;
      default:
        pNVar9 = this_01;
        if ((uVar6 == 0x10) || (pNVar9 = this_00, uVar6 == 0x20)) break;
        if (uVar6 == 0x40) {
          dVar4 = *pNVar10;
          uVar22 = SUB84(dVar4,0);
          uVar23 = (undefined4)((ulong)dVar4 >> 0x20);
          if (-1 < ((anon_struct_16_2_f898271f *)(pNVar10 + -1))->sign) {
            dVar24 = dVar2;
            if (((anon_struct_16_2_f898271f *)(pNVar10 + -1))->sign == 0) {
              bVar21 = dVar4 == dVar2;
              goto LAB_00142147;
            }
            goto LAB_00142131;
          }
          bVar21 = dVar4 == dVar2;
          bVar20 = dVar4 < dVar2;
          goto LAB_00142135;
        }
        if (uVar6 == 0x80) {
          dVar4 = *pNVar10;
          uVar22 = SUB84(dVar4,0);
          uVar23 = (undefined4)((ulong)dVar4 >> 0x20);
          if (((anon_struct_16_2_f898271f *)(pNVar10 + -1))->sign < 0) {
            bVar21 = dVar4 == dVar1;
            bVar20 = dVar4 < dVar1;
            goto LAB_00142135;
          }
          dVar24 = dVar1;
          if (((anon_struct_16_2_f898271f *)(pNVar10 + -1))->sign != 0) goto LAB_00142131;
          bVar21 = dVar4 == dVar1;
        }
        else {
          if (uVar6 != 0x100) goto switchD_001420a1_caseD_3;
          dVar4 = *pNVar10;
          uVar22 = SUB84(dVar4,0);
          uVar23 = (undefined4)((ulong)dVar4 >> 0x20);
          if (((anon_struct_16_2_f898271f *)(pNVar10 + -1))->sign < 0) {
            bVar21 = dVar4 == dVar5;
            bVar20 = dVar4 < dVar5;
            goto LAB_00142135;
          }
          dVar24 = dVar5;
          if (((anon_struct_16_2_f898271f *)(pNVar10 + -1))->sign != 0) goto LAB_00142131;
          bVar21 = dVar4 == dVar5;
        }
        goto LAB_00142147;
      }
      pNVar15 = NaVector::operator[](pNVar9,0);
      uVar22 = SUB84(*pNVar15,0);
      uVar23 = (undefined4)((ulong)*pNVar15 >> 0x20);
LAB_0014211d:
      dVar24 = *pNVar10;
      if (((anon_struct_16_2_f898271f *)(pNVar10 + -1))->sign < 0) {
LAB_00142131:
        bVar21 = dVar24 == (double)CONCAT44(uVar23,uVar22);
        bVar20 = dVar24 < (double)CONCAT44(uVar23,uVar22);
LAB_00142135:
        bVar21 = !bVar20 && !bVar21;
      }
      else {
        if (((anon_struct_16_2_f898271f *)(pNVar10 + -1))->sign != 0) {
          bVar21 = (double)CONCAT44(uVar23,uVar22) == dVar24;
          bVar20 = (double)CONCAT44(uVar23,uVar22) < dVar24;
          goto LAB_00142135;
        }
        bVar21 = (double)CONCAT44(uVar23,uVar22) == dVar24;
      }
LAB_00142147:
      if (!bVar21) {
        uVar19 = 0;
      }
      uVar18 = uVar18 | uVar19;
switchD_001420a1_caseD_3:
      pNVar10 = pNVar10 + 2;
    }
    if ((uVar18 & 0x3ff) != 0) {
      pcVar16 = NaPetriNode::name(&this->super_NaPetriNode);
      uVar6 = 0;
      NaPrintLog("Statistics node \'%s\' caused halt due to:\n",pcVar16);
      for (lVar17 = 0; lVar17 != 0x50; lVar17 = lVar17 + 8) {
        if ((uVar18 >> (uVar6 & 0x1f) & 1) != 0) {
          NaPrintLog("  %s[0] %s %g\n",
                     (int)*(undefined8 *)((long)&this->HaltCond[0].value + lVar17 * 2),
                     *(undefined8 *)((long)szId + lVar17),
                     szSign[(long)*(int *)((long)&this->HaltCond[0].sign + lVar17 * 2) + 1]);
        }
        uVar6 = uVar6 + 1;
      }
      (*(this->super_NaPetriNode)._vptr_NaPetriNode[5])(this);
      return;
    }
  }
  return;
}

Assistant:

void
NaPNStatistics::action ()
{
  unsigned    i;
  NaVector    &x = signal.data();

  if(nGapAct >= nGapWidth && nGapWidth > 0)
    {
      // prepare next gap session
      Mean.init_zero();
      RMS.init_zero();
      StdDev.init_zero();
      Min.init_zero();
      Max.init_zero();

      Sum.init_zero();
      Sum2.init_zero();

      // reset activations counter
      nGapAct = 0;
    }

  // one more activation
  ++nGapAct;

  // compute basic statistics
  for(i = 0; i < x.dim(); ++i){
    Sum[i] += x[i];
    Sum2[i] += x[i] * x[i];

    if(nGapAct == 1){
      Min[i] = x[i];
      Max[i] = x[i];
    }else{
      if(x[i] < Min[i]){
	Min[i] = x[i];
      }
      if(x[i] > Max[i]){
	Max[i] = x[i];
      }
    }

    Mean[i] = Sum[i] / nGapAct;
    RMS[i] = Sum2[i] / nGapAct;
    StdDev[i] = sqrt(RMS[i] - Mean[i] * Mean[i]);

  }// for each item of input dimension

  // compute final statistics
  NaReal	fAbs;
  if(fabs(Min[0]) > fabs(Max[0]))
    fAbs = fabs(Min[0]);
  else
    fAbs = fabs(Max[0]);

  int	id, j = 0;
  NaReal	fTime = net()->timer().CurrentTime();
  int		iTimeIndex = net()->timer().CurrentIndex();

  // put needed statistics to output
  for(id = 0; id < NaSI_number; ++id){
    switch(mOutStat & NaSIdToMask(id))
      {
      case NaSM_ABSMEAN:stat.data()[j++] = fabs(Mean[0]);break;
      case NaSM_MEAN:	stat.data()[j++] = Mean[0];	break;
      case NaSM_RMS:	stat.data()[j++] = RMS[0];	break;
      case NaSM_STDDEV:	stat.data()[j++] = StdDev[0];	break;
      case NaSM_MAX:	stat.data()[j++] = Max[0];	break;
      case NaSM_MIN:	stat.data()[j++] = Min[0];	break;
      case NaSM_ABSMAX:	stat.data()[j++] = fAbs;	break;
      case NaSM_TIME:	stat.data()[j++] = fTime;	break;
      case NaSM_TINDEX: stat.data()[j++] = iTimeIndex;	break;
      case NaSM_VALUE:  stat.data()[j++] = x[0];	break;
      }
  }

  // check some statistics for halt condition
  if(nGapAct >= nGapWidth && nGapWidth > 0)
    {
      int	mHaltedBy = 0;
      for(id = 0; id < NaSI_number; ++id){
	switch(mHalt & NaSIdToMask(id))
	  {
	  case NaSM_ABSMEAN:
	    mHaltedBy |=
	      check_condition(fabs(Mean[0]), HaltCond[id].sign,
			      HaltCond[id].value)
	      ? NaSIdToMask(id) : 0;
	    break;
	  case NaSM_MEAN:
	    mHaltedBy |=
	      check_condition(Mean[0], HaltCond[id].sign, HaltCond[id].value)
	      ? NaSIdToMask(id) : 0;
	    break;
	  case NaSM_RMS:
	    mHaltedBy |=
	      check_condition(RMS[0], HaltCond[id].sign, HaltCond[id].value)
	      ? NaSIdToMask(id) : 0;
	    break;
	  case NaSM_STDDEV:
	    mHaltedBy |=
	      check_condition(StdDev[0], HaltCond[id].sign, HaltCond[id].value)
	      ? NaSIdToMask(id) : 0;
	    break;
	  case NaSM_MAX:
	    mHaltedBy |=
	      check_condition(Max[0], HaltCond[id].sign, HaltCond[id].value)
	      ? NaSIdToMask(id) : 0;
	    break;
	  case NaSM_MIN:
	    mHaltedBy |=
	      check_condition(Min[0], HaltCond[id].sign, HaltCond[id].value)
	      ? NaSIdToMask(id) : 0;
	    break;
	  case NaSM_ABSMAX:
	    mHaltedBy |=
	      check_condition(fAbs, HaltCond[id].sign, HaltCond[id].value)
	      ? NaSIdToMask(id) : 0;
	    break;
	  case NaSM_TIME:
	    mHaltedBy |=
	      check_condition(fTime, HaltCond[id].sign, HaltCond[id].value)
	      ? NaSIdToMask(id) : 0;
	    break;
	  case NaSM_TINDEX:
	    mHaltedBy |=
	      check_condition(iTimeIndex, HaltCond[id].sign, HaltCond[id].value)
	      ? NaSIdToMask(id) : 0;
	    break;
	  }// switch
      }// for each id

      // if any of halt flags is true...
      if(mHaltedBy & NaSM_ALL){
	NaPrintLog("Statistics node '%s' caused halt due to:\n", name());
	for(id = 0; id < NaSI_number; ++id){
	  if(mHaltedBy & NaSIdToMask(id))
	    NaPrintLog("  %s[0] %s %g\n", szId[id],
		       szSign[1 + HaltCond[id].sign], HaltCond[id].value);
	}

	// some halt condition results true
	halt();
      }
    }
}